

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vad_core.c
# Opt level: O2

int WebRtcVad_CalcVad8khz(VadInstT *inst,int16_t *speech_frame,size_t frame_length)

{
  int16_t *piVar1;
  int16_t *data;
  int16_t *weights;
  short den;
  bool bVar2;
  sbyte sVar3;
  ushort uVar4;
  bool bVar5;
  int16_t iVar6;
  ushort uVar7;
  ushort uVar8;
  short sVar9;
  int16_t iVar10;
  int32_t iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  short sVar17;
  long lVar18;
  int16_t *piVar19;
  int16_t *piVar20;
  int16_t *piVar21;
  ushort uVar22;
  short sVar23;
  short sVar24;
  long lVar25;
  int16_t *piVar26;
  long lVar27;
  int16_t iVar28;
  uint uVar29;
  short sVar30;
  uint uVar31;
  int iVar32;
  ushort uVar33;
  int16_t *piVar34;
  int16_t *local_160;
  int local_158;
  int16_t *local_140;
  int16_t *local_138;
  int16_t *local_130;
  int16_t *local_120;
  int16_t *local_118;
  long local_110;
  int16_t feature_vector [6];
  uint local_b8 [2];
  int32_t noise_probability [2];
  int16_t sgprvec [12];
  int16_t ngprvec [12];
  int16_t deltaS [12];
  int16_t deltaN [12];
  
  iVar6 = WebRtcVad_CalculateFeatures(inst,speech_frame,frame_length,feature_vector);
  ngprvec[0] = 0;
  ngprvec[1] = 0;
  ngprvec[2] = 0;
  ngprvec[3] = 0;
  ngprvec[4] = 0;
  ngprvec[5] = 0;
  ngprvec[6] = 0;
  ngprvec[7] = 0;
  ngprvec[8] = 0;
  ngprvec[9] = 0;
  ngprvec[10] = 0;
  ngprvec[0xb] = 0;
  sgprvec[0] = 0;
  sgprvec[1] = 0;
  sgprvec[2] = 0;
  sgprvec[3] = 0;
  sgprvec[4] = 0;
  sgprvec[5] = 0;
  sgprvec[6] = 0;
  sgprvec[7] = 0;
  sgprvec[8] = 0;
  sgprvec[9] = 0;
  sgprvec[10] = 0;
  sgprvec[0xb] = 0;
  if (frame_length == 0x50) {
    lVar18 = 0x2d6;
    lVar16 = 0x2d0;
    lVar25 = 0x2ca;
    lVar27 = 0x2c4;
  }
  else if (frame_length == 0xa0) {
    lVar18 = 0x2d8;
    lVar16 = 0x2d2;
    lVar25 = 0x2cc;
    lVar27 = 0x2c6;
  }
  else {
    lVar18 = 0x2da;
    lVar16 = 0x2d4;
    lVar25 = 0x2ce;
    lVar27 = 0x2c8;
  }
  if (10 < iVar6) {
    sVar9 = *(short *)((long)inst->downsampling_filter_states + lVar18 + -4);
    iVar6 = *(int16_t *)((long)inst->downsampling_filter_states + lVar25 + -4);
    iVar10 = *(int16_t *)((long)inst->downsampling_filter_states + lVar27 + -4);
    sVar23 = *(short *)((long)inst->downsampling_filter_states + lVar16 + -4);
    piVar1 = inst->noise_means;
    piVar20 = inst->speech_stds;
    local_110 = 0;
    local_130 = deltaS;
    local_160 = deltaN;
    local_158 = 1;
    bVar5 = false;
    iVar32 = 0;
    local_138 = piVar1;
    for (lVar16 = 0; lVar16 != 6; lVar16 = lVar16 + 1) {
      lVar18 = 0;
      uVar14 = 0;
      uVar29 = 0;
      for (lVar25 = 0; lVar25 != 0x18; lVar25 = lVar25 + 0xc) {
        iVar11 = WebRtcVad_GaussianProbability
                           (feature_vector[lVar16],*(int16_t *)((long)local_138 + lVar25),
                            *(int16_t *)((long)local_138 + lVar25 + 0x30),
                            (int16_t *)((long)local_160 + lVar25));
        iVar15 = *(short *)((long)kNoiseDataWeights + local_110 + lVar25) * iVar11;
        *(int *)((long)noise_probability + lVar18) = iVar15;
        uVar14 = uVar14 + iVar15;
        iVar11 = WebRtcVad_GaussianProbability
                           (feature_vector[lVar16],*(int16_t *)((long)local_138 + lVar25 + 0x18),
                            *(int16_t *)((long)local_138 + lVar25 + 0x48),
                            (int16_t *)((long)local_130 + lVar25));
        iVar15 = *(short *)((long)kSpeechDataWeights + local_110 + lVar25) * iVar11;
        *(int *)((long)local_b8 + lVar18) = iVar15;
        uVar29 = uVar29 + iVar15;
        lVar18 = lVar18 + 4;
      }
      iVar13 = 0x1f;
      iVar15 = iVar13;
      if (uVar14 != 0) {
        uVar12 = (int)uVar14 >> 0x1f ^ uVar14;
        uVar31 = 0x20;
        if (uVar12 != 0) {
          uVar31 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> uVar31 == 0; uVar31 = uVar31 - 1) {
            }
          }
          uVar31 = uVar31 ^ 0x1f;
        }
        iVar15 = uVar31 - 1;
      }
      if (uVar29 != 0) {
        uVar12 = (int)uVar29 >> 0x1f ^ uVar29;
        uVar31 = 0x20;
        if (uVar12 != 0) {
          uVar31 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> uVar31 == 0; uVar31 = uVar31 - 1) {
            }
          }
          uVar31 = uVar31 ^ 0x1f;
        }
        iVar13 = uVar31 - 1;
      }
      sVar30 = kSpectrumWeight[lVar16];
      if ((int)sVar23 < (iVar15 - iVar13) * 4) {
        bVar5 = true;
      }
      sVar24 = (short)(uVar14 >> 0xc);
      if (sVar24 < 1) {
        sVar24 = 0x4000;
      }
      else {
        iVar11 = WebRtcSpl_DivW32W16((noise_probability[0] & 0x3ffff000U) << 2,sVar24);
        sVar24 = (short)iVar11;
        ngprvec[lVar16 + 6] = 0x4000 - sVar24;
      }
      ngprvec[lVar16] = sVar24;
      sVar24 = (short)(uVar29 >> 0xc);
      if (0 < sVar24) {
        iVar11 = WebRtcSpl_DivW32W16((local_b8[0] & 0x3ffff000) << 2,sVar24);
        sgprvec[lVar16] = (short)iVar11;
        sgprvec[lVar16 + 6] = 0x4000 - (short)iVar11;
      }
      iVar32 = (iVar15 - iVar13) * (int)sVar30 + iVar32;
      local_110 = local_110 + 2;
      local_130 = local_130 + 1;
      local_138 = local_138 + 1;
      local_160 = local_160 + 1;
    }
    bVar2 = sVar9 <= iVar32;
    sVar9 = 0x3200;
    uVar4 = 0x2400;
    local_118 = deltaN;
    local_120 = ngprvec;
    local_138 = deltaS;
    local_140 = sgprvec;
    piVar19 = piVar1;
    piVar26 = inst->speech_means;
    for (lVar16 = 0; lVar16 != 6; lVar16 = lVar16 + 1) {
      uVar7 = WebRtcVad_FindMinimum(inst,feature_vector[lVar16],(int)lVar16);
      data = piVar1 + lVar16;
      weights = kNoiseDataWeights + lVar16;
      uVar14 = WeightedAverage(data,0,weights);
      uVar22 = 0x280;
      piVar34 = kMinimumMean;
      lVar18 = 0;
      uVar33 = uVar4;
      for (lVar25 = 0; lVar25 != 0x18; lVar25 = lVar25 + 0xc) {
        sVar23 = *(short *)((long)piVar20 + lVar25 + -0x48);
        sVar30 = (short)((uint)(((int)((uint)uVar7 * 0x100000 + (uVar14 & 0xffffffc0) * -0x400) >>
                                0x10) * 0x4d00) >> 0x10);
        if (bVar5 || bVar2) {
          den = *(short *)((long)piVar20 + lVar25);
          uVar8 = sVar23 + sVar30;
          if ((short)uVar8 <= (short)uVar22) {
            uVar8 = uVar22;
          }
          sVar23 = *(short *)((long)piVar20 + lVar25 + -0x30);
          if (uVar33 <= uVar8) {
            uVar8 = uVar33;
          }
          *(ushort *)((long)piVar20 + lVar25 + -0x48) = uVar8;
          sVar30 = *(short *)((long)local_140 + lVar25);
          sVar24 = *(short *)((long)local_138 + lVar25);
          sVar17 = (short)(((short)((uint)((int)sVar30 * (int)sVar24) >> 0xb) * 0x199a >> 0x15) + 1U
                          >> 1) + sVar23;
          if (sVar17 <= *piVar34) {
            sVar17 = *piVar34;
          }
          if ((short)(sVar9 + 0x280) <= sVar17) {
            sVar17 = sVar9 + 0x280;
          }
          *(short *)((long)piVar20 + lVar25 + -0x30) = sVar17;
          piVar21 = (int16_t *)((long)piVar20 + lVar25);
          iVar32 = ((int)sVar30 >> 2) *
                   (((int)(short)(feature_vector[lVar16] -
                                 (short)((uint)(sVar23 * 0x2000 + 0x8000) >> 0x10)) * (int)sVar24 >>
                    3) + -0x1000) >> 4;
          if (iVar32 < 1) {
            iVar11 = WebRtcSpl_DivW32W16(-iVar32,den * 10);
            iVar32 = -iVar11;
          }
          else {
            iVar32 = WebRtcSpl_DivW32W16(iVar32,den * 10);
          }
          iVar15 = 0x800000;
          sVar3 = 0x18;
        }
        else {
          sVar24 = *(short *)((long)local_120 + lVar25);
          sVar17 = *(short *)((long)local_118 + lVar25);
          uVar8 = (short)((short)((uint)((int)sVar24 * (int)sVar17) >> 0xb) * 0x28f >> 0x16) +
                  sVar30 + sVar23;
          den = *(int16_t *)((long)piVar20 + lVar25 + -0x18);
          if ((short)uVar8 <= (short)uVar22) {
            uVar8 = uVar22;
          }
          if (uVar33 <= uVar8) {
            uVar8 = uVar33;
          }
          *(ushort *)((long)piVar20 + lVar25 + -0x48) = uVar8;
          piVar21 = inst->noise_stds + lVar18 * 6 + lVar16;
          iVar32 = (sVar24 * 0x4000 + 0x8000 >> 0x10) *
                   (((int)(short)(feature_vector[lVar16] - (sVar23 >> 3)) * (int)sVar17 >> 3) +
                   -0x1000) >> 0xe;
          if (iVar32 < 1) {
            iVar11 = WebRtcSpl_DivW32W16(-iVar32,den);
            iVar32 = -iVar11;
          }
          else {
            iVar32 = WebRtcSpl_DivW32W16(iVar32,den);
          }
          iVar15 = 0x200000;
          sVar3 = 0x16;
        }
        iVar28 = den + (short)(iVar32 * 0x10000 + iVar15 >> sVar3);
        if (iVar28 < 0x181) {
          iVar28 = 0x180;
        }
        *piVar21 = iVar28;
        lVar18 = lVar18 + 1;
        uVar33 = uVar33 + 0x80;
        uVar22 = uVar22 + 0x80;
        piVar34 = piVar34 + 1;
      }
      uVar14 = WeightedAverage(data,0,weights);
      piVar34 = inst->speech_means + lVar16;
      uVar29 = WeightedAverage(piVar34,0,kSpeechDataWeights + lVar16);
      sVar9 = (short)(uVar29 >> 9) - (short)(uVar14 >> 9);
      if (sVar9 < kMinimumDifference[lVar16]) {
        iVar32 = (int)(short)(kMinimumDifference[lVar16] - sVar9);
        uVar29 = WeightedAverage(piVar34,(int16_t)((uint)(iVar32 * 0xd) >> 2),
                                 kSpeechDataWeights + lVar16);
        uVar14 = WeightedAverage(data,-(short)((uint)(iVar32 * 0xc000) >> 0x10),weights);
      }
      sVar9 = kMaximumSpeech[lVar16];
      sVar23 = (short)(uVar29 >> 7);
      if (sVar9 < sVar23) {
        for (lVar18 = 0; lVar18 != 0x18; lVar18 = lVar18 + 0xc) {
          *(short *)((long)piVar26 + lVar18) = *(short *)((long)piVar26 + lVar18) + (sVar9 - sVar23)
          ;
        }
      }
      sVar30 = (short)(uVar14 >> 7);
      sVar23 = kMaximumNoise[lVar16];
      if (sVar23 < sVar30) {
        for (lVar18 = 0; lVar18 != 0x18; lVar18 = lVar18 + 0xc) {
          *(short *)((long)piVar19 + lVar18) =
               *(short *)((long)piVar19 + lVar18) + (sVar23 - sVar30);
        }
      }
      uVar4 = uVar4 - 0x80;
      local_118 = local_118 + 1;
      local_120 = local_120 + 1;
      local_138 = local_138 + 1;
      local_140 = local_140 + 1;
      piVar20 = piVar20 + 1;
      piVar26 = piVar26 + 1;
      piVar19 = piVar19 + 1;
    }
    inst->frame_counter = inst->frame_counter + 1;
    if (bVar5 || bVar2) {
      sVar9 = inst->num_of_speech + 1;
      inst->num_of_speech = sVar9;
      if (6 < sVar9) {
        inst->num_of_speech = 6;
        iVar10 = iVar6;
      }
      inst->over_hang = iVar10;
      goto LAB_0011eb6e;
    }
  }
  sVar9 = inst->over_hang;
  if (sVar9 < 1) {
    local_158 = 0;
  }
  else {
    inst->over_hang = sVar9 + -1;
    local_158 = (int)(short)(sVar9 + 2);
  }
  inst->num_of_speech = 0;
LAB_0011eb6e:
  inst->vad = local_158;
  return local_158;
}

Assistant:

int WebRtcVad_CalcVad8khz(VadInstT* inst, const int16_t* speech_frame,
                          size_t frame_length)
{
    int16_t feature_vector[kNumChannels], total_power;

    // Get power in the bands
    total_power = WebRtcVad_CalculateFeatures(inst, speech_frame, frame_length,
                                              feature_vector);

    // Make a VAD
    inst->vad = GmmProbability(inst, feature_vector, total_power, frame_length);

    return inst->vad;
}